

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Superposition.cpp
# Opt level: O0

Clause * __thiscall
Inferences::Superposition::performSuperposition
          (Superposition *this,Clause *rwClause,Literal *rwLit,TermList rwTerm,Clause *eqClause,
          Literal *eqLit,TermList eqLHS,AbstractingUnifier *unifier,bool eqIsResult)

{
  TermList trm;
  TermList trm_00;
  TermList by;
  TermList by_00;
  RefIterator it;
  TermList what;
  TermList what_00;
  TermList eqLHS_00;
  TermList rewritten;
  TermList sort;
  PartialRedundancyHandler *pPVar1;
  byte bVar2;
  Literal *pLVar3;
  Clause *pCVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  Result RVar8;
  int iVar9;
  QuestionAnsweringMode QVar10;
  ProofExtra PVar11;
  TermList *pTVar12;
  Options *pOVar13;
  LiteralSelector *pLVar14;
  Literal **ppLVar15;
  AnswerLiteralManager *pAVar16;
  TwoLiteralRewriteInferenceExtra *this_00;
  undefined8 in_RCX;
  Literal *in_RDX;
  Clause *in_RSI;
  long *in_RDI;
  Clause *in_R8;
  Stack<Kernel::Literal_*> *in_R9;
  Literal **in_stack_00000008;
  AbstractingUnifier *in_stack_00000010;
  byte in_stack_00000018;
  Clause *clause;
  Literal *condLit;
  Literal *newLitD;
  Literal *newLitC;
  Result o;
  Literal *currAfter_1;
  Literal *curr_1;
  uint i_1;
  Literal *eqLitS;
  Literal *currAfter;
  Literal *curr;
  uint i;
  uint weight;
  bool bothHaveAnsLit;
  Literal *eqAnsLit;
  Literal *rwAnsLit;
  bool synthesis;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> res;
  TermList eqLHSS;
  Literal *tgtLitS;
  TermList arg1;
  TermList arg0;
  Result comp;
  TermList rwTermS;
  Literal *rwLitS;
  TermList tgtTermS;
  Ordering *ordering;
  PartialRedundancyHandler *parRedHandler;
  bool hasAgeLimitStrike;
  bool andThatsIt;
  PassiveClauseContainer *passiveClauseContainer;
  Destroyer inf_destroyer;
  Inference inf;
  uint numPositiveLiteralsLowerBound;
  TermList tgtTerm;
  uint eqLength;
  uint rwLength;
  TermList eqLHSsort;
  ResultSubstitutionSP subst;
  TermList in_stack_fffffffffffff998;
  Term *pTVar17;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffff9a0;
  Stack<Kernel::Literal_*> *pSVar18;
  Result in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  uint in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b4;
  TermList in_stack_fffffffffffff9b8;
  Literal *in_stack_fffffffffffff9c0;
  RobSubstitution *in_stack_fffffffffffff9c8;
  Clause *pCVar19;
  Clause *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  TermList in_stack_fffffffffffff9e0;
  undefined8 in_stack_fffffffffffff9e8;
  undefined6 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f6;
  undefined1 in_stack_fffffffffffff9f7;
  TermList in_stack_fffffffffffff9f8;
  TermList in_stack_fffffffffffffa00;
  Inference *in_stack_fffffffffffffa08;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffffa10;
  Clause *in_stack_fffffffffffffa18;
  Clause *in_stack_fffffffffffffa20;
  undefined1 uVar20;
  Superposition *in_stack_fffffffffffffa28;
  Clause *in_stack_fffffffffffffa30;
  Literal *in_stack_fffffffffffffa38;
  Clause *in_stack_fffffffffffffa40;
  TermList in_stack_fffffffffffffa48;
  TermList in_stack_fffffffffffffa50;
  TermList in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa7c;
  PassiveClauseContainer *in_stack_fffffffffffffa88;
  uint in_stack_fffffffffffffa90;
  Inference *in_stack_fffffffffffffa98;
  byte local_4f2;
  bool local_4e1;
  Literal *local_4e0;
  Literal *local_4d0;
  byte local_361;
  _func_int **local_308 [2];
  SplitSet *local_2f8;
  void *pvStack_2f0;
  anon_union_8_2_f154dc0f_for_Term_10 local_2e8;
  TermList TStack_2e0;
  Clause *local_2d0;
  Stack<Kernel::Literal_*> *local_2c8;
  Literal *local_2c0;
  Literal *local_2b8;
  RefIterator local_2a0;
  int local_28c;
  Term *local_288;
  Stack<Kernel::Literal_*> *local_280;
  uint local_274;
  uint64_t local_270;
  uint64_t local_268;
  uint64_t local_260;
  Literal *local_258;
  uint64_t local_250;
  uint64_t local_248;
  Term *local_240;
  Literal *local_238;
  uint local_22c;
  uint local_228;
  bool local_221;
  Literal *local_220;
  Literal *local_218;
  byte local_209;
  Literal **local_1f8;
  uint64_t local_1f0;
  uint64_t local_1e8;
  uint64_t local_1e0;
  Term *local_1d8;
  Literal **local_1d0;
  uint64_t local_1c8;
  uint64_t local_1c0;
  uint64_t local_1b8;
  uint64_t local_1b0;
  uint64_t local_1a8;
  uint64_t local_1a0;
  uint64_t local_198;
  uint64_t local_190;
  Result local_184;
  undefined8 local_180;
  uint64_t local_178;
  Term *local_170;
  Term *local_168;
  uint64_t local_160;
  Ordering *local_158;
  PartialRedundancyHandler *local_150;
  Stack<Kernel::Literal_*> local_148;
  undefined8 local_128;
  byte local_11a;
  byte local_119;
  PassiveClauseContainer *local_118;
  Destroyer local_110;
  GeneratingInference2 local_108;
  undefined1 local_f0 [52];
  uint local_bc;
  Literal **local_b8;
  Term *local_b0;
  uint local_a4;
  uint local_a0;
  undefined4 local_9c;
  Literal **local_98;
  uint64_t local_80;
  SmartPtr<Indexing::ResultSubstitution> local_78;
  byte local_61;
  Stack<Kernel::Literal_*> *local_60;
  Clause *local_58;
  Literal *local_50;
  Clause *local_48;
  Literal **local_38;
  undefined8 local_30;
  Clause *local_28;
  
  local_38 = in_stack_00000008;
  local_61 = in_stack_00000018 & 1;
  local_60 = in_R9;
  local_58 = in_R8;
  local_50 = in_RDX;
  local_48 = in_RSI;
  local_30 = in_RCX;
  Kernel::AbstractingUnifier::subs((AbstractingUnifier *)0x831cf5);
  Indexing::ResultSubstitution::fromSubstitution
            (in_stack_fffffffffffff9c8,(int)((ulong)in_stack_fffffffffffff9c0 >> 0x20),
             (int)in_stack_fffffffffffff9c0);
  local_80 = (uint64_t)
             Kernel::SortHelper::getEqualityArgumentSort(in_stack_fffffffffffff9b8._content);
  bVar5 = Kernel::TermList::isVar((TermList *)in_stack_fffffffffffff9a0);
  if (bVar5) {
    local_98 = local_38;
    eqLHS_00._content._4_4_ = in_stack_fffffffffffff9dc;
    eqLHS_00._content._0_4_ = in_stack_fffffffffffff9d8;
    bVar5 = checkSuperpositionFromVariable
                      (in_stack_fffffffffffff9d0,(Literal *)in_stack_fffffffffffff9c8,eqLHS_00);
    if (!bVar5) {
      local_28 = (Clause *)0x0;
      local_9c = 1;
      goto LAB_00833908;
    }
  }
  bVar5 = checkClauseColorCompatibility
                    (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  uVar20 = (undefined1)((ulong)in_stack_fffffffffffffa20 >> 0x38);
  if (!bVar5) {
    local_28 = (Clause *)0x0;
    local_9c = 1;
    goto LAB_00833908;
  }
  local_a0 = Kernel::Clause::length(local_48);
  local_a4 = Kernel::Clause::length(local_58);
  local_b8 = local_38;
  local_b0 = (Term *)Kernel::EqHelper::getOtherEqualitySide
                               ((Literal *)0x831e8c,in_stack_fffffffffffff998);
  uVar6 = Kernel::Clause::numPositiveLiterals
                    ((Clause *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
  uVar7 = Kernel::Clause::numPositiveLiterals
                    ((Clause *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
  local_bc = Lib::Int::max(uVar6 - 1,uVar7);
  bVar5 = Kernel::AbstractingUnifier::usesUwa(in_stack_00000010);
  Kernel::GeneratingInference2::GeneratingInference2
            (&local_108,bVar5 * '\x02' + SUPERPOSITION,local_48,local_58);
  Kernel::Inference::Inference
            ((Inference *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
             (GeneratingInference2 *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
  Kernel::Inference::Destroyer::Destroyer(&local_110,(Inference *)local_f0);
  local_118 = Saturation::SaturationAlgorithm::getPassiveClauseContainer
                        ((SaturationAlgorithm *)0x831f93);
  local_119 = 0;
  local_361 = 0;
  if (local_118 != (PassiveClauseContainer *)0x0) {
    uVar6 = (*(local_118->super_RandomAccessClauseContainer).super_ClauseContainer.
              _vptr_ClauseContainer[0xf])();
    local_361 = 0;
    if ((uVar6 & 1) != 0) {
      iVar9 = (*(local_118->super_RandomAccessClauseContainer).super_ClauseContainer.
                _vptr_ClauseContainer[0x10])(local_118,(ulong)local_bc,local_f0,&local_119);
      local_361 = (byte)iVar9;
    }
  }
  local_11a = local_361 & 1;
  if ((local_11a == 0) || ((local_119 & 1) == 0)) {
    if (local_11a != 0) {
      local_128 = local_30;
      local_148._end = local_38;
      local_148._cursor = (Literal **)local_b0;
      Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr
                ((SmartPtr<Indexing::ResultSubstitution> *)&local_148,&local_78);
      in_stack_fffffffffffff9c0 = (Literal *)local_f0;
      in_stack_fffffffffffff9b8._content =
           CONCAT44((int)(in_stack_fffffffffffff9b8._content >> 0x20),local_bc);
      in_stack_fffffffffffff9b0 = (uint)local_118;
      in_stack_fffffffffffff9b4 = (undefined4)((ulong)local_118 >> 0x20);
      in_stack_fffffffffffff9a8 = local_61 & GREATER;
      in_stack_fffffffffffff9a0 = &local_148;
      in_stack_fffffffffffff998._content = (uint64_t)local_148._cursor;
      bVar5 = earlyWeightLimitCheck
                        (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                         in_stack_fffffffffffffa30,(Literal *)in_stack_fffffffffffffa28,
                         in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                         in_stack_fffffffffffffa48,
                         (ResultSubstitutionSP *)
                         CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),(bool)uVar20,
                         in_stack_fffffffffffffa88,in_stack_fffffffffffffa90,
                         in_stack_fffffffffffffa98);
      Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
                ((SmartPtr<Indexing::ResultSubstitution> *)in_stack_fffffffffffff9a0);
      if (((bVar5 ^ 0xffU) & 1) != 0) {
        local_28 = (Clause *)0x0;
        local_9c = 1;
        goto LAB_008338d0;
      }
    }
    local_150 = Saturation::SaturationAlgorithm::parRedHandler((SaturationAlgorithm *)0x832269);
    bVar5 = Kernel::AbstractingUnifier::usesUwa(in_stack_00000010);
    pCVar4 = local_48;
    pLVar3 = local_50;
    pCVar19 = local_58;
    pSVar18 = local_60;
    bVar2 = local_61;
    pPVar1 = local_150;
    if (!bVar5) {
      in_stack_fffffffffffff998._content =
           (uint64_t)Lib::SmartPtr<Indexing::ResultSubstitution>::ptr(&local_78);
      uVar6 = (*pPVar1->_vptr_PartialRedundancyHandler[2])
                        (pPVar1,pCVar19,pSVar18,pCVar4,pLVar3,(ulong)(bVar2 & 1));
      if ((uVar6 & 1) == 0) {
        local_28 = (Clause *)0x0;
        local_9c = 1;
        goto LAB_008338d0;
      }
    }
    local_158 = Saturation::SaturationAlgorithm::getOrdering((SaturationAlgorithm *)0x8323b3);
    Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(&local_78);
    local_168 = local_b0;
    local_160 = (uint64_t)
                Indexing::ResultSubstitution::apply<Kernel::TermList>
                          ((ResultSubstitution *)
                           CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                           in_stack_fffffffffffff9b8,
                           SUB41((uint)in_stack_fffffffffffff9ac >> 0x18,0));
    Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(&local_78);
    local_170 = &Indexing::ResultSubstitution::apply<Kernel::Literal*>
                           ((ResultSubstitution *)
                            CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                            (Literal *)in_stack_fffffffffffff9a0,
                            SUB81(in_stack_fffffffffffff998._content >> 0x38,0))->super_Term;
    Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(&local_78);
    local_180 = local_30;
    local_198 = (uint64_t)
                Indexing::ResultSubstitution::apply<Kernel::TermList>
                          ((ResultSubstitution *)
                           CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                           in_stack_fffffffffffff9b8,
                           SUB41((uint)in_stack_fffffffffffff9ac >> 0x18,0));
    local_190 = local_160;
    local_178 = local_198;
    local_184 = (*local_158->_vptr_Ordering[3])(local_158,local_160,local_198);
    bVar5 = Kernel::Ordering::isGreaterOrEqual(local_184);
    if (bVar5) {
      local_28 = (Clause *)0x0;
      local_9c = 1;
    }
    else {
      bVar5 = Kernel::Literal::isEquality((Literal *)0x83258b);
      if (bVar5) {
        pTVar12 = Kernel::Term::nthArgument(local_170,0);
        local_1a0 = pTVar12->_content;
        pTVar12 = Kernel::Term::nthArgument(local_170,1);
        local_1a8 = pTVar12->_content;
        local_1b0 = local_178;
        trm._content._4_4_ = in_stack_fffffffffffff9ac;
        trm._content._0_4_ = in_stack_fffffffffffff9a8;
        bVar5 = Kernel::TermList::containsSubterm((TermList *)in_stack_fffffffffffff9a0,trm);
        if (bVar5) {
          local_1b8 = local_178;
          trm_00._content._4_4_ = in_stack_fffffffffffff9ac;
          trm_00._content._0_4_ = in_stack_fffffffffffff9a8;
          bVar5 = Kernel::TermList::containsSubterm((TermList *)in_stack_fffffffffffff9a0,trm_00);
          if (!bVar5) {
            RVar8 = Kernel::Ordering::getEqualityArgumentOrder
                              ((Ordering *)in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
            RVar8 = Kernel::Ordering::reverse(RVar8);
            bVar5 = Kernel::Ordering::isGreaterOrEqual(RVar8);
            if (bVar5) {
              local_28 = (Clause *)0x0;
              local_9c = 1;
              goto LAB_008338d0;
            }
          }
        }
        else {
          RVar8 = Kernel::Ordering::getEqualityArgumentOrder
                            ((Ordering *)in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
          bVar5 = Kernel::Ordering::isGreaterOrEqual(RVar8);
          if (bVar5) {
            local_28 = (Clause *)0x0;
            local_9c = 1;
            goto LAB_008338d0;
          }
        }
      }
      bVar5 = Kernel::AbstractingUnifier::usesUwa(in_stack_00000010);
      pCVar4 = local_48;
      pCVar19 = local_58;
      pSVar18 = local_60;
      bVar2 = local_61;
      pPVar1 = local_150;
      pTVar17 = local_170;
      RVar8 = local_184;
      if (!bVar5) {
        local_1c0 = local_178;
        local_1c8 = local_160;
        local_1d0 = local_38;
        in_stack_fffffffffffff9b8._content =
             (uint64_t)Lib::SmartPtr<Indexing::ResultSubstitution>::ptr(&local_78);
        in_stack_fffffffffffff9b0 = bVar2 & 1;
        (*pPVar1->_vptr_PartialRedundancyHandler[3])
                  (pPVar1,pCVar19,pCVar4,local_1c0,local_1c8,local_1d0);
        in_stack_fffffffffffff998._content = (uint64_t)pTVar17;
        in_stack_fffffffffffff9a0 = pSVar18;
        in_stack_fffffffffffff9a8 = RVar8;
      }
      local_1e0 = local_178;
      local_1e8 = local_160;
      what._content._4_4_ = in_stack_fffffffffffff9b4;
      what._content._0_4_ = in_stack_fffffffffffff9b0;
      by._content._4_4_ = in_stack_fffffffffffff9ac;
      by._content._0_4_ = in_stack_fffffffffffff9a8;
      local_1d8 = &Kernel::EqHelper::replace((Literal *)in_stack_fffffffffffff9a0,what,by)->
                   super_Term;
      if ((performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
           ::doSimS == '\0') &&
         (iVar9 = __cxa_guard_acquire(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                                       ::doSimS), iVar9 != 0)) {
        pOVar13 = (Options *)(**(code **)(*in_RDI + 0x20))();
        performSuperposition::doSimS = Shell::Options::simulatenousSuperposition(pOVar13);
        __cxa_guard_release(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                             ::doSimS);
      }
      bVar5 = Kernel::EqHelper::isEqTautology((Literal *)in_stack_fffffffffffff9a0);
      if (bVar5) {
        local_28 = (Clause *)0x0;
        local_9c = 1;
      }
      else {
        Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(&local_78);
        local_1f8 = local_38;
        local_1f0 = (uint64_t)
                    Indexing::ResultSubstitution::apply<Kernel::TermList>
                              ((ResultSubstitution *)
                               CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                               in_stack_fffffffffffff9b8,
                               SUB41((uint)in_stack_fffffffffffff9ac >> 0x18,0));
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)in_stack_fffffffffffff9a0);
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x832a47);
        Kernel::AbstractingUnifier::maxNumberOfConstraints((AbstractingUnifier *)0x832a7b);
        Lib::Stack<Kernel::Literal_*>::reserve
                  ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffff9d0,
                   (size_t)in_stack_fffffffffffff9c8);
        QVar10 = Shell::Options::questionAnswering(Lib::env);
        local_209 = QVar10 == SYNTHESIS;
        if ((bool)local_209) {
          local_4d0 = Kernel::Clause::getAnswerLiteral
                                ((Clause *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
        else {
          local_4d0 = (Literal *)0x0;
        }
        local_218 = local_4d0;
        if ((local_209 & 1) == 0) {
          local_4e0 = (Literal *)0x0;
        }
        else {
          local_4e0 = Kernel::Clause::getAnswerLiteral
                                ((Clause *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
        local_220 = local_4e0;
        local_4e1 = local_218 != (Literal *)0x0 && local_4e0 != (Literal *)0x0;
        local_221 = local_4e1;
        if ((performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
             ::afterCheck == '\0') &&
           (iVar9 = __cxa_guard_acquire(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                                         ::afterCheck), iVar9 != 0)) {
          pOVar13 = (Options *)(**(code **)(*in_RDI + 0x20))();
          bVar5 = Shell::Options::literalMaximalityAftercheck(pOVar13);
          local_4f2 = 0;
          if (bVar5) {
            pLVar14 = Saturation::SaturationAlgorithm::getLiteralSelector
                                ((SaturationAlgorithm *)0x832c23);
            iVar9 = (*pLVar14->_vptr_LiteralSelector[2])();
            local_4f2 = (byte)iVar9;
          }
          performSuperposition::afterCheck = (bool)(local_4f2 & 1);
          __cxa_guard_release(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                               ::afterCheck);
        }
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x832c7f);
        Lib::Stack<Kernel::Literal_*>::push
                  (in_stack_fffffffffffff9a0,(Literal *)in_stack_fffffffffffff998._content);
        local_228 = Kernel::Term::weight(local_1d8);
        for (local_22c = 0; uVar20 = (undefined1)((ulong)in_stack_fffffffffffff9e8 >> 0x38),
            local_22c < local_a0; local_22c = local_22c + 1) {
          ppLVar15 = Kernel::Clause::operator[](local_48,local_22c);
          local_238 = *ppLVar15;
          if ((local_238 != local_50) && (((local_221 & 1U) == 0 || (local_238 != local_218)))) {
            Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(&local_78);
            local_240 = &Indexing::ResultSubstitution::apply<Kernel::Literal*>
                                   ((ResultSubstitution *)
                                    CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                                    (Literal *)in_stack_fffffffffffff9a0,
                                    SUB81(in_stack_fffffffffffff998._content >> 0x38,0))->super_Term
            ;
            if ((performSuperposition::doSimS & 1U) != 0) {
              local_248 = local_178;
              local_250 = local_160;
              what_00._content._4_4_ = in_stack_fffffffffffff9b4;
              what_00._content._0_4_ = in_stack_fffffffffffff9b0;
              by_00._content._4_4_ = in_stack_fffffffffffff9ac;
              by_00._content._0_4_ = in_stack_fffffffffffff9a8;
              local_240 = &Kernel::EqHelper::replace
                                     ((Literal *)in_stack_fffffffffffff9a0,what_00,by_00)->
                           super_Term;
            }
            bVar5 = Kernel::EqHelper::isEqTautology((Literal *)in_stack_fffffffffffff9a0);
            if (bVar5) {
              local_28 = (Clause *)0x0;
              goto LAB_008338b2;
            }
            if ((local_11a & 1) != 0) {
              uVar6 = Kernel::Term::weight(local_240);
              local_228 = local_228 + uVar6;
              uVar6 = (*(local_118->super_RandomAccessClauseContainer).super_ClauseContainer.
                        _vptr_ClauseContainer[0x11])
                                (local_118,(ulong)local_228,(ulong)local_bc,local_f0);
              if ((uVar6 & 1) != 0) {
                *(int *)(DAT_01333840 + 0x1e4) = *(int *)(DAT_01333840 + 0x1e4) + 1;
                local_28 = (Clause *)0x0;
                goto LAB_008338b2;
              }
            }
            uVar6 = local_22c;
            if (((performSuperposition::afterCheck & 1U) != 0) &&
               (uVar7 = Kernel::Clause::numSelected(local_48), uVar6 < uVar7)) {
              iVar9 = (*local_158->_vptr_Ordering[2])(local_158,local_240,local_170);
              if (iVar9 == 1) {
                *(int *)(DAT_01333840 + 0x1e8) = *(int *)(DAT_01333840 + 0x1e8) + 1;
                local_28 = (Clause *)0x0;
                goto LAB_008338b2;
              }
            }
            Lib::
            Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
            operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        *)0x832ff3);
            Lib::Stack<Kernel::Literal_*>::push
                      (in_stack_fffffffffffff9a0,(Literal *)in_stack_fffffffffffff998._content);
          }
        }
        local_258 = (Literal *)0x0;
        if (((performSuperposition::afterCheck & 1U) != 0) &&
           (uVar6 = Kernel::Clause::numSelected(local_58), 1 < uVar6)) {
          local_260 = local_1f0;
          local_268 = local_160;
          local_270 = local_80;
          sort._content._6_1_ = in_stack_fffffffffffff9f6;
          sort._content._0_6_ = in_stack_fffffffffffff9f0;
          sort._content._7_1_ = in_stack_fffffffffffff9f7;
          local_258 = Kernel::Literal::createEquality
                                ((bool)uVar20,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                                 sort);
        }
        for (local_274 = 0; local_274 < local_a4; local_274 = local_274 + 1) {
          ppLVar15 = Kernel::Clause::operator[](local_58,local_274);
          local_280 = (Stack<Kernel::Literal_*> *)*ppLVar15;
          if (local_280 != local_60) {
            Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(&local_78);
            local_288 = &Indexing::ResultSubstitution::apply<Kernel::Literal*>
                                   ((ResultSubstitution *)
                                    CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                                    (Literal *)in_stack_fffffffffffff9a0,
                                    SUB81(in_stack_fffffffffffff998._content >> 0x38,0))->super_Term
            ;
            bVar5 = Kernel::EqHelper::isEqTautology((Literal *)in_stack_fffffffffffff9a0);
            if (bVar5) {
              local_28 = (Clause *)0x0;
              goto LAB_008338b2;
            }
            if ((local_11a & 1) != 0) {
              uVar6 = Kernel::Term::weight(local_288);
              local_228 = local_228 + uVar6;
              uVar6 = (*(local_118->super_RandomAccessClauseContainer).super_ClauseContainer.
                        _vptr_ClauseContainer[0x11])
                                (local_118,(ulong)local_228,(ulong)local_bc,local_f0);
              if ((uVar6 & 1) != 0) {
                *(int *)(DAT_01333840 + 0x1e4) = *(int *)(DAT_01333840 + 0x1e4) + 1;
                local_28 = (Clause *)0x0;
                goto LAB_008338b2;
              }
            }
            uVar6 = local_274;
            if ((local_258 != (Literal *)0x0) &&
               (uVar7 = Kernel::Clause::numSelected(local_58), uVar6 < uVar7)) {
              local_28c = (*local_158->_vptr_Ordering[2])(local_158,local_288,local_258);
              if ((local_28c == 1) || (local_28c == 3)) {
                *(int *)(DAT_01333840 + 0x1e8) = *(int *)(DAT_01333840 + 0x1e8) + 1;
                local_28 = (Clause *)0x0;
                goto LAB_008338b2;
              }
            }
            Lib::
            Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
            operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        *)0x833358);
            Lib::Stack<Kernel::Literal_*>::push
                      (in_stack_fffffffffffff9a0,(Literal *)in_stack_fffffffffffff998._content);
          }
        }
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x8333a0);
        Kernel::AbstractingUnifier::computeConstraintLiterals
                  ((AbstractingUnifier *)in_stack_fffffffffffff9b8._content);
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x8333ce);
        local_2a0 = Lib::Stack<Kernel::Literal_*>::iter((Stack<Kernel::Literal_*> *)0x8333e5);
        it._pointer._4_4_ = in_stack_fffffffffffff9ac;
        it._pointer._0_4_ = in_stack_fffffffffffff9a8;
        it._stack._0_4_ = in_stack_fffffffffffff9b0;
        it._stack._4_4_ = in_stack_fffffffffffff9b4;
        Lib::Stack<Kernel::Literal*>::loadFromIterator<Lib::Stack<Kernel::Literal*>::RefIterator>
                  (in_stack_fffffffffffff9a0,it);
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)in_stack_fffffffffffff9e0._content);
        if ((local_221 & 1U) != 0) {
          Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(&local_78);
          local_2b8 = Indexing::ResultSubstitution::apply<Kernel::Literal*>
                                ((ResultSubstitution *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                                 (Literal *)in_stack_fffffffffffff9a0,
                                 SUB81(in_stack_fffffffffffff998._content >> 0x38,0));
          Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(&local_78);
          local_2c0 = Indexing::ResultSubstitution::apply<Kernel::Literal*>
                                ((ResultSubstitution *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                                 (Literal *)in_stack_fffffffffffff9a0,
                                 SUB81(in_stack_fffffffffffff998._content >> 0x38,0));
          Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(&local_78);
          in_stack_fffffffffffffa10 =
               (Stack<Kernel::Literal_*> *)
               Indexing::ResultSubstitution::apply<Kernel::Literal*>
                         ((ResultSubstitution *)
                          CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                          (Literal *)in_stack_fffffffffffff9a0,
                          SUB81(in_stack_fffffffffffff998._content >> 0x38,0));
          local_2c8 = in_stack_fffffffffffffa10;
          in_stack_fffffffffffffa08 =
               (Inference *)
               Lib::
               Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               ::operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                             *)0x83354f);
          pAVar16 = Shell::AnswerLiteralManager::getInstance();
          (*pAVar16->_vptr_AnswerLiteralManager[5])(pAVar16,local_2c8,local_2b8,local_2c0);
          Lib::Stack<Kernel::Literal_*>::push
                    (in_stack_fffffffffffff9a0,(Literal *)in_stack_fffffffffffff998._content);
        }
        if ((local_11a & 1) == 0) {
LAB_00833642:
          bVar5 = Kernel::AbstractingUnifier::usesUwa(in_stack_00000010);
          if (bVar5) {
            if (local_48 == local_58) {
              *(int *)(DAT_01333840 + 0x50) = *(int *)(DAT_01333840 + 0x50) + 1;
            }
            else if ((local_61 & 1) == 0) {
              *(int *)(DAT_01333840 + 0x58) = *(int *)(DAT_01333840 + 0x58) + 1;
            }
            else {
              *(int *)(DAT_01333840 + 0x54) = *(int *)(DAT_01333840 + 0x54) + 1;
            }
          }
          else if (local_48 == local_58) {
            *(int *)(DAT_01333840 + 0x4c) = *(int *)(DAT_01333840 + 0x4c) + 1;
          }
          else if ((local_61 & 1) == 0) {
            *(int *)(DAT_01333840 + 0x48) = *(int *)(DAT_01333840 + 0x48) + 1;
          }
          else {
            *(int *)(DAT_01333840 + 0x44) = *(int *)(DAT_01333840 + 0x44) + 1;
          }
          Kernel::Inference::Destroyer::disable(&local_110);
          Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)0x83373b);
          local_2e8 = (anon_union_8_2_f154dc0f_for_Term_10)local_f0._32_8_;
          TStack_2e0._content = local_f0._40_8_;
          local_2f8 = (SplitSet *)local_f0._16_8_;
          pvStack_2f0 = (void *)local_f0._24_8_;
          local_308[0] = (_func_int **)local_f0._0_8_;
          local_308[1] = (_func_int **)local_f0._8_8_;
          in_stack_fffffffffffff9e0._content =
               (uint64_t)
               Kernel::Clause::fromStack(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
          Kernel::Inference::~Inference((Inference *)local_308);
          local_2d0 = (Clause *)in_stack_fffffffffffff9e0._content;
          PVar11 = Shell::Options::proofExtra(Lib::env);
          if (PVar11 == FULL) {
            pCVar19 = local_2d0;
            this_00 = (TwoLiteralRewriteInferenceExtra *)::operator_new(0x40);
            rewritten._content._4_4_ = PVar11;
            rewritten._content._0_4_ = in_stack_fffffffffffff9d8;
            TwoLiteralRewriteInferenceExtra::TwoLiteralRewriteInferenceExtra
                      (this_00,(Literal *)pCVar19,in_stack_fffffffffffff9c0,
                       in_stack_fffffffffffff9e0,rewritten);
            Lib::ProofExtra::insert
                      ((ProofExtra *)this_00,&pCVar19->super_Unit,
                       (InferenceExtra *)in_stack_fffffffffffff9c0);
          }
          local_28 = local_2d0;
        }
        else {
          uVar6 = (*(local_118->super_RandomAccessClauseContainer).super_ClauseContainer.
                    _vptr_ClauseContainer[0x11])
                            (local_118,(ulong)local_228,(ulong)local_bc,local_f0);
          if ((uVar6 & 1) == 0) goto LAB_00833642;
          *(int *)(DAT_01333840 + 0x1e4) = *(int *)(DAT_01333840 + 0x1e4) + 1;
          local_28 = (Clause *)0x0;
        }
LAB_008338b2:
        local_9c = 1;
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)in_stack_fffffffffffff9e0._content);
      }
    }
  }
  else {
    *(int *)(DAT_01333840 + 0x1e4) = *(int *)(DAT_01333840 + 0x1e4) + 1;
    local_28 = (Clause *)0x0;
    local_9c = 1;
  }
LAB_008338d0:
  Kernel::Inference::Destroyer::~Destroyer((Destroyer *)in_stack_fffffffffffff9a0);
  Kernel::Inference::~Inference((Inference *)local_f0);
LAB_00833908:
  Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
            ((SmartPtr<Indexing::ResultSubstitution> *)in_stack_fffffffffffff9a0);
  return local_28;
}

Assistant:

Clause* Superposition::performSuperposition(
    Clause* rwClause, Literal* rwLit, TermList rwTerm,
    Clause* eqClause, Literal* eqLit, TermList eqLHS,
    AbstractingUnifier* unifier, bool eqIsResult)
{
  TIME_TRACE("perform superposition");
  // we want the rwClause and eqClause to be active
  ASS(rwClause->store()==Clause::ACTIVE);
  ASS(eqClause->store()==Clause::ACTIVE);

  // the first checks the reference and the second checks the stack
  auto subst = ResultSubstitution::fromSubstitution(&unifier->subs(), RetrievalAlgorithms::DefaultVarBanks::query, RetrievalAlgorithms::DefaultVarBanks::internal);
  TermList eqLHSsort = SortHelper::getEqualityArgumentSort(eqLit);

  if(eqLHS.isVar()) {
    if(!checkSuperpositionFromVariable(eqClause, eqLit, eqLHS)) {
      return 0;
    }
  }

  if(!checkClauseColorCompatibility(eqClause, rwClause)) {
    return 0;
  }

  unsigned rwLength = rwClause->length();
  unsigned eqLength = eqClause->length();

  TermList tgtTerm = EqHelper::getOtherEqualitySide(eqLit, eqLHS);

  // LRS-specific optimization:
  // check whether we can conclude that the resulting clause will be discarded by LRS since it does not fulfil the age/weight limits (in which case we can discard the clause)
  // we already know the age here so we can immediately conclude whether the clause fulfils the age limit
  // since we have not built the clause yet we compute lower bounds on the weight of the clause after each step and recheck whether the weight-limit can still be fulfilled.

  unsigned numPositiveLiteralsLowerBound = Int::max(eqClause->numPositiveLiterals()-1, rwClause->numPositiveLiterals()); // lower bound on number of positive literals, don't know at this point whether duplicate positive literals will occur
  //TODO update inference rule name AYB
  Inference inf(GeneratingInference2(unifier->usesUwa() ? InferenceRule::CONSTRAINED_SUPERPOSITION : InferenceRule::SUPERPOSITION, rwClause, eqClause));
  Inference::Destroyer inf_destroyer(inf);

  auto passiveClauseContainer = _salg->getPassiveClauseContainer();
  bool andThatsIt = false;
  bool hasAgeLimitStrike = passiveClauseContainer && passiveClauseContainer->mayBeAbleToDiscriminateClausesUnderConstructionOnLimits()
                        && passiveClauseContainer->exceedsAgeLimit(numPositiveLiteralsLowerBound, inf, andThatsIt);

  if(hasAgeLimitStrike && andThatsIt) { // we are dealing with purely age-limited container (no need for weight-related investigations)
    env.statistics->discardedNonRedundantClauses++;
    RSTAT_CTR_INC("superpositions skipped for (pure) age limit before building clause");
    return 0;
  }

  if(hasAgeLimitStrike) {
    if(!earlyWeightLimitCheck(eqClause, eqLit, rwClause, rwLit, rwTerm, eqLHS, tgtTerm, subst, eqIsResult, passiveClauseContainer, numPositiveLiteralsLowerBound, inf)) {
      return 0;
    }
  }

  const auto& parRedHandler = _salg->parRedHandler();
  if (!unifier->usesUwa()) {
    if (!parRedHandler.checkSuperposition(eqClause, eqLit, rwClause, rwLit, eqIsResult, subst.ptr())) {
      return 0;
    }
  }

  const Ordering& ordering = _salg->getOrdering();

  TermList tgtTermS = subst->apply(tgtTerm, eqIsResult);

  Literal* rwLitS = subst->apply(rwLit, !eqIsResult);
  TermList rwTermS = subst->apply(rwTerm, !eqIsResult);

  //cout << "Check ordering on " << tgtTermS.toString() << " and " << rwTermS.toString() << endl;

  //check that we're not rewriting smaller subterm with larger
  auto comp = ordering.compare(tgtTermS,rwTermS);
  if(Ordering::isGreaterOrEqual(comp)) {
    return 0;
  }

  if(rwLitS->isEquality()) {
    //check that we're not rewriting only the smaller side of an equality
    TermList arg0=*rwLitS->nthArgument(0);
    TermList arg1=*rwLitS->nthArgument(1);

    if(!arg0.containsSubterm(rwTermS)) {
      if(Ordering::isGreaterOrEqual(ordering.getEqualityArgumentOrder(rwLitS))) {
        return 0;
      }
    } else if(!arg1.containsSubterm(rwTermS)) {
      if(Ordering::isGreaterOrEqual(Ordering::reverse(ordering.getEqualityArgumentOrder(rwLitS)))) {
        return 0;
      }
    }
  }

  if (!unifier->usesUwa()) {
    parRedHandler.insertSuperposition(
      eqClause, rwClause, rwTermS, tgtTermS, eqLHS, rwLitS, eqLit, comp, eqIsResult, subst.ptr());
  }

  Literal* tgtLitS = EqHelper::replace(rwLitS,rwTermS,tgtTermS);

  static bool doSimS = getOptions().simulatenousSuperposition();

  //check we don't create an equational tautology (this happens during self-superposition)
  if(EqHelper::isEqTautology(tgtLitS)) {
    return 0;
  }

  TermList eqLHSS = subst->apply(eqLHS, eqIsResult);

#if VDEBUG
  if(!unifier->usesUwa()){
    ASS_EQ(rwTermS,eqLHSS);
  }
#endif

  Recycled<Stack<Literal*>> res;
  res->reserve(rwLength + eqLength - 1 + unifier->maxNumberOfConstraints());

  bool synthesis = (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS);
  Literal* rwAnsLit = synthesis ? rwClause->getAnswerLiteral() : nullptr;
  Literal* eqAnsLit = synthesis ? eqClause->getAnswerLiteral() : nullptr;
  bool bothHaveAnsLit = (rwAnsLit != nullptr) && (eqAnsLit != nullptr);

  static bool afterCheck = getOptions().literalMaximalityAftercheck() && _salg->getLiteralSelector().isBGComplete();

  res->push(tgtLitS);
  unsigned weight=tgtLitS->weight();
  for(unsigned i=0;i<rwLength;i++) {
    Literal* curr=(*rwClause)[i];
    if(curr!=rwLit && (!bothHaveAnsLit || curr!=rwAnsLit)) {
      Literal* currAfter = subst->apply(curr, !eqIsResult);

      if (doSimS) {
        currAfter = EqHelper::replace(currAfter,rwTermS,tgtTermS);
      }

      if(EqHelper::isEqTautology(currAfter)) {
        return nullptr;
      }

      if(hasAgeLimitStrike) {
        weight+=currAfter->weight();
        if(passiveClauseContainer->exceedsWeightLimit(weight, numPositiveLiteralsLowerBound, inf)) {
          RSTAT_CTR_INC("superpositions skipped for weight limit while constructing other literals");
          env.statistics->discardedNonRedundantClauses++;
          return nullptr;
        }
      }

      if (afterCheck) {
        TIME_TRACE(TimeTrace::LITERAL_ORDER_AFTERCHECK)
        if (i < rwClause->numSelected() && ordering.compare(currAfter,rwLitS) == Ordering::GREATER) {
          env.statistics->inferencesBlockedForOrderingAftercheck++;
          return nullptr;
        }
      }

      res->push(currAfter);
    }
  }

  {
    Literal* eqLitS = 0;
    if (afterCheck && eqClause->numSelected() > 1) {
      TIME_TRACE(TimeTrace::LITERAL_ORDER_AFTERCHECK);
      eqLitS = Literal::createEquality(true,eqLHSS,tgtTermS,eqLHSsort);
    }

    for(unsigned i=0;i<eqLength;i++) {
      Literal* curr=(*eqClause)[i];
      if(curr!=eqLit) {
        Literal* currAfter = subst->apply(curr, eqIsResult);

        if(EqHelper::isEqTautology(currAfter)) {
          return nullptr;
        }
        if(hasAgeLimitStrike) {
          weight+=currAfter->weight();
          if(passiveClauseContainer->exceedsWeightLimit(weight, numPositiveLiteralsLowerBound, inf)) {
            RSTAT_CTR_INC("superpositions skipped for weight limit while constructing other literals");
            env.statistics->discardedNonRedundantClauses++;
            return nullptr;
          }
        }

        if (eqLitS && i < eqClause->numSelected()) {
          TIME_TRACE(TimeTrace::LITERAL_ORDER_AFTERCHECK);

          Ordering::Result o = ordering.compare(currAfter,eqLitS);

          if (o == Ordering::GREATER || o == Ordering::EQUAL) {
            env.statistics->inferencesBlockedForOrderingAftercheck++;
            return nullptr;
          }
        }

        res->push(currAfter);
      }
    }
  }

  res->loadFromIterator(unifier->computeConstraintLiterals()->iter());

  if (bothHaveAnsLit) {
    Literal* newLitC = subst->apply(rwAnsLit, !eqIsResult);
    Literal* newLitD = subst->apply(eqAnsLit, eqIsResult);
    Literal* condLit = subst->apply(eqLit, eqIsResult);
    res->push(SynthesisALManager::getInstance()->makeITEAnswerLiteral(condLit, newLitC, newLitD));
  }

  if(hasAgeLimitStrike && passiveClauseContainer->exceedsWeightLimit(weight, numPositiveLiteralsLowerBound, inf)) {
    RSTAT_CTR_INC("superpositions skipped for weight limit after the clause was built");
    env.statistics->discardedNonRedundantClauses++;
    return nullptr;
  }

  if(!unifier->usesUwa()){
    if(rwClause==eqClause) {
      env.statistics->selfSuperposition++;
    } else if(eqIsResult) {
      env.statistics->forwardSuperposition++;
    } else {
      env.statistics->backwardSuperposition++;
    }
  } else {
    if(rwClause==eqClause) {
      env.statistics->cSelfSuperposition++;
    } else if(eqIsResult) {
      env.statistics->cForwardSuperposition++;
    } else {
      env.statistics->cBackwardSuperposition++;
    }
  }

  inf_destroyer.disable(); // ownership passed to the the clause below
  auto clause = Clause::fromStack(*res, inf);

  if(env.options->proofExtra() == Options::ProofExtra::FULL)
    env.proofExtra.insert(clause, new SuperpositionExtra(
      rwLit,
      eqLit,
      eqLHS,
      rwTerm
    ));

  return clause;
}